

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

void sanitize_player_loc(chunk *c,player *p)

{
  loc grid;
  loc grid_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  loc lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  lVar4.x = (p->grid).x;
  lVar4.y = (p->grid).y;
  _Var1 = square_in_bounds_fully((chunk_conflict *)c,lVar4);
  if (((_Var1) &&
      (grid.x = (p->grid).x, grid.y = (p->grid).y,
      _Var1 = square_isarrivable((chunk_conflict *)c,grid), _Var1)) &&
     (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y,
     _Var1 = square_isvault((chunk_conflict *)c,grid_00), !_Var1)) {
    return;
  }
  for (iVar5 = -1000; iVar5 != 0; iVar5 = iVar5 + 1) {
    uVar2 = Rand_div(c->width + L'\xffffffff');
    iVar7 = uVar2 + 1;
    uVar2 = Rand_div(c->height + L'\xffffffff');
    iVar8 = uVar2 + 1;
    lVar4 = (loc)loc(iVar7,iVar8);
    _Var1 = square_isempty((chunk_conflict *)c,lVar4);
    if (_Var1) {
      lVar4 = (loc)loc(iVar7,iVar8);
      _Var1 = square_isvault((chunk_conflict *)c,lVar4);
      if (!_Var1) {
        (p->grid).y = iVar8;
        (p->grid).x = iVar7;
        return;
      }
    }
  }
  uVar2 = Rand_div(c->width + L'\xffffffff');
  uVar3 = Rand_div(c->height + L'\xffffffff');
  iVar5 = uVar2 + 2;
  if (iVar5 < c->width + L'\xffffffff') {
    iVar7 = 1;
    iVar6 = 1;
    iVar8 = uVar3 + 1;
    while( true ) {
      lVar4 = (loc)loc(iVar5,iVar8);
      _Var1 = square_isempty((chunk_conflict *)c,lVar4);
      if (_Var1) {
        lVar4 = (loc)loc(iVar5,iVar8);
        _Var1 = square_isvault((chunk_conflict *)c,lVar4);
        iVar7 = iVar8;
        iVar6 = iVar5;
        if (!_Var1) {
          (p->grid).y = iVar8;
          (p->grid).x = iVar5;
          return;
        }
      }
      if ((uVar2 + 1 == iVar5) && (iVar8 == uVar3 + 1)) break;
      iVar5 = iVar5 + 1;
      if (c->width + L'\xffffffff' <= iVar5) {
        iVar8 = iVar8 + 1;
LAB_00154208:
        iVar5 = 1;
        if (c->height + L'\xffffffff' <= iVar8) {
          iVar8 = 1;
        }
      }
    }
    (p->grid).x = iVar6;
    (p->grid).y = iVar7;
    return;
  }
  iVar8 = uVar3 + 2;
  iVar7 = 1;
  iVar6 = 1;
  goto LAB_00154208;
}

Assistant:

static void sanitize_player_loc(struct chunk *c, struct player *p)
{
	/* TODO potential problem: stairs in vaults? */

	/* allow direct transfer if target location is teleportable */
	if (square_in_bounds_fully(c, p->grid)
		&& square_isarrivable(c, p->grid)
		&& !square_isvault(c, p->grid)) {
		return;
	}

	/* TODO should use something similar to teleport code, but this will
	 *  do for now as a quick'n dirty fix
	 */
	int tx, ty; // test locations
	int ix, iy; // initial location
	int vx = 1, vy = 1; // fallback vault location
	int try = 1000; // attempts

	/* a bunch of random locations */
	while (try) {
		try = try - 1;
		tx = randint0(c->width - 1) + 1;
		ty = randint0(c->height - 1) + 1;
		if (square_isempty(c, loc(tx, ty))
			&& !square_isvault(c, loc(tx, ty))) {
			p->grid.y = ty;
			p->grid.x = tx;
			return;
		}
	}

	/* whelp, that didnt work */
	ix = randint0(c->width - 1) + 1;
	iy = randint0(c->height - 1) + 1;
	ty = iy;
	tx = ix + 1;
	if (tx >= c->width - 1) {
		tx = 1;
		ty = ty + 1;
		if (ty >= c->height -1) {
			ty = 1;
		}
	}

	while (1) {		//until full loop through dungeon
		if (square_isempty(c, loc(tx, ty))) {
			if (!square_isvault(c, loc(tx, ty))) {
				// ok location
				p->grid.y = ty;
				p->grid.x = tx;
				return;
			}
			// vault, but lets remember it just in case
			vy = ty;
			vx = tx;
		}
		// oops tried *every* tile...
		if (tx == ix && ty == iy) {
			break;
		}
		tx = tx + 1;
		if (tx >= c->width - 1) {
			tx = 1;
			ty = ty + 1;
			if (ty >= c->height -1) {
				ty = 1;
			}
		}
	}

	// fallback vault location (or at least a non-crashy square)
	p->grid.x = vx;
	p->grid.y = vy;
}